

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::FiberPool::Impl::~Impl(Impl *this)

{
  FiberStack *pFVar1;
  anon_union_64_2_b7b882c4_for_CoreLocalFreelist_0 *paVar2;
  bool bVar3;
  uint *puVar4;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *pdVar5;
  reference ppFVar6;
  FiberStack **stack_1;
  iterator __end2;
  iterator __begin2;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *__range2;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> dangling;
  undefined1 local_88 [8];
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  FiberStack *stack;
  FiberStack **__end4;
  FiberStack **__begin4;
  FiberStack *(*__range4) [2];
  Iterator local_50;
  uint i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_int> *__range3;
  Type local_28;
  undefined1 local_20 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:538:7)>
  _kjDefer538;
  Impl *this_local;
  
  _kjDefer538.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:538:7)>_2
        )this;
  if (this->coreLocalFreelists != (CoreLocalFreelist *)0x0) {
    local_28.this = this;
    defer<kj::FiberPool::Impl::~Impl()::_lambda()_1_>((kj *)local_20,&local_28);
    ___end3 = zeroTo<unsigned_int>(this->nproc);
    i = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3);
    local_50 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end3);
    while (bVar3 = Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_50),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      puVar4 = Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
      __end4 = (FiberStack **)(this->coreLocalFreelists + *puVar4);
      paVar2 = &((CoreLocalFreelist *)__end4)->field_0;
      for (; __end4 != (FiberStack **)((long)paVar2 + 0x10); __end4 = __end4 + 1) {
        pFVar1 = *__end4;
        lock.ptr = (deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)pFVar1;
        if ((pFVar1 != (FiberStack *)0x0) && (pFVar1 != (FiberStack *)0x0)) {
          kj::_::FiberStack::~FiberStack(pFVar1);
          operator_delete(pFVar1,0x20);
        }
      }
      Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
    }
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:538:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:538:7)>
                 *)local_20);
  }
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
  lockExclusive((MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                 *)local_88,&this->freelist);
  pdVar5 = Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::operator*
                     ((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                       *)local_88);
  pdVar5 = mv<std::deque<kj::_::FiberStack*,std::allocator<kj::_::FiberStack*>>>(pdVar5);
  std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::deque
            ((deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)&__range2,pdVar5);
  std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::begin
            ((iterator *)&__end2._M_node,
             (deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)&__range2);
  std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::end
            ((iterator *)&stack_1,
             (deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)&__range2);
  while (bVar3 = std::operator==((_Self *)&__end2._M_node,(_Self *)&stack_1),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    ppFVar6 = std::_Deque_iterator<kj::_::FiberStack_*,_kj::_::FiberStack_*&,_kj::_::FiberStack_**>
              ::operator*((_Deque_iterator<kj::_::FiberStack_*,_kj::_::FiberStack_*&,_kj::_::FiberStack_**>
                           *)&__end2._M_node);
    pFVar1 = *ppFVar6;
    if (pFVar1 != (FiberStack *)0x0) {
      kj::_::FiberStack::~FiberStack(pFVar1);
      operator_delete(pFVar1,0x20);
    }
    std::_Deque_iterator<kj::_::FiberStack_*,_kj::_::FiberStack_*&,_kj::_::FiberStack_**>::
    operator++((_Deque_iterator<kj::_::FiberStack_*,_kj::_::FiberStack_*&,_kj::_::FiberStack_**> *)
               &__end2._M_node);
  }
  std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::~deque
            ((deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)&__range2);
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::~Locked
            ((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *)
             local_88);
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
  ~MutexGuarded(&this->freelist);
  return;
}

Assistant:

~Impl() noexcept(false) {
#if USE_CORE_LOCAL_FREELISTS
    if (coreLocalFreelists != nullptr) {
      KJ_DEFER(free(coreLocalFreelists));

      for (uint i: kj::zeroTo(nproc)) {
        for (auto stack: coreLocalFreelists[i].stacks) {
          if (stack != nullptr) {
            delete stack;
          }
        }
      }
    }
#endif

    // Make sure we're not leaking anything from the global freelist either.
    auto lock = freelist.lockExclusive();
    auto dangling = kj::mv(*lock);
    for (auto& stack: dangling) {
      delete stack;
    }
  }